

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O2

vector<Card_*,_std::allocator<Card_*>_> * __thiscall
Player::getAvailableCards
          (vector<Card_*,_std::allocator<Card_*>_> *__return_storage_ptr__,Player *this,Type color)

{
  pointer ppCVar1;
  Type TVar2;
  pointer __x;
  vector<Card_*,_std::allocator<Card_*>_> available_cards;
  _Vector_base<Card_*,_std::allocator<Card_*>_> local_48;
  
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ppCVar1 = (this->_hand).super__Vector_base<Card_*,_std::allocator<Card_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (__x = (this->_hand).super__Vector_base<Card_*,_std::allocator<Card_*>_>._M_impl.
             super__Vector_impl_data._M_start; __x != ppCVar1; __x = __x + 1) {
    TVar2 = Card::getColor(*__x);
    if (TVar2 == color) {
      std::vector<Card_*,_std::allocator<Card_*>_>::push_back
                ((vector<Card_*,_std::allocator<Card_*>_> *)&local_48,__x);
    }
  }
  if (local_48._M_impl.super__Vector_impl_data._M_start ==
      local_48._M_impl.super__Vector_impl_data._M_finish) {
    std::vector<Card_*,_std::allocator<Card_*>_>::vector(__return_storage_ptr__,&this->_hand);
  }
  else {
    (__return_storage_ptr__->super__Vector_base<Card_*,_std::allocator<Card_*>_>)._M_impl.
    super__Vector_impl_data._M_start = local_48._M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->super__Vector_base<Card_*,_std::allocator<Card_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = local_48._M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->super__Vector_base<Card_*,_std::allocator<Card_*>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_48._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  std::_Vector_base<Card_*,_std::allocator<Card_*>_>::~_Vector_base(&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Card *> Player::getAvailableCards(Color::Type color) {
    std::vector<Card *> available_cards;
    copy_if(_hand.begin(), _hand.end(), std::back_inserter(available_cards),
            [color](const Card *card) {
                return card->getColor() == color;
            });
    if (available_cards.empty()) return _hand;
    return available_cards;
}